

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

idx_t __thiscall
duckdb::QuantileCursor<duckdb::hugeint_t>::Seek
          (QuantileCursor<duckdb::hugeint_t> *this,idx_t row_idx)

{
  bool bVar1;
  sel_t sVar2;
  hugeint_t *phVar3;
  ValidityMask *pVVar4;
  QuantileCursor<duckdb::hugeint_t> *in_RSI;
  QuantileCursor<duckdb::hugeint_t> *in_RDI;
  
  bVar1 = RowIsVisible(in_RDI,(idx_t)in_RSI);
  if (!bVar1) {
    duckdb::ColumnDataCollection::Seek
              ((ulong)in_RDI->inputs,(ColumnDataScanState *)in_RSI,(DataChunk *)&in_RDI->scan);
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)in_RSI,(size_type)in_RDI);
    phVar3 = FlatVector::GetData<duckdb::hugeint_t>((Vector *)0xa2b430);
    in_RDI->data = phVar3;
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)in_RSI,(size_type)in_RDI);
    pVVar4 = FlatVector::Validity((Vector *)0xa2b453);
    in_RDI->validity = pVVar4;
  }
  sVar2 = RowOffset(in_RSI,(idx_t)in_RDI);
  return (ulong)sVar2;
}

Assistant:

inline idx_t Seek(idx_t row_idx) {
		if (!RowIsVisible(row_idx)) {
			inputs.Seek(row_idx, scan, page);
			data = FlatVector::GetData<INPUT_TYPE>(page.data[0]);
			validity = &FlatVector::Validity(page.data[0]);
		}
		return RowOffset(row_idx);
	}